

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O3

void __thiscall de::Socket::shutdownReceive(Socket *this)

{
  deBool dVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  dVar1 = deSocket_shutdown(this->m_socket,1);
  if (dVar1 != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Socket receive channel shutdown failed","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0010dd78;
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Socket::shutdownReceive (void)
{
	if (!deSocket_shutdown(m_socket, DE_SOCKETCHANNEL_RECEIVE))
		throw SocketError("Socket receive channel shutdown failed");
}